

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  ushort uVar2;
  u8 *__dest;
  long lVar3;
  ulong __n;
  int rc;
  u8 *local_60;
  int local_34;
  
  local_60 = *ppData;
  if (0 < nCell) {
    puVar1 = pPg->aData;
    lVar3 = (long)iFirst;
    do {
      uVar2 = pCArray->szCell[lVar3];
      if (uVar2 == 0) {
        uVar2 = computeCellSize(pCArray,(int)lVar3);
      }
      __n = (ulong)uVar2;
      if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
         (__dest = pageFindSlot(pPg,(uint)uVar2,&local_34), __dest == (u8 *)0x0)) {
        if ((long)local_60 - (long)pBegin < (long)__n) {
          return 1;
        }
        __dest = local_60 + -__n;
        local_60 = __dest;
      }
      memmove(__dest,pCArray->apCell[lVar3],__n);
      uVar2 = (short)__dest - (short)puVar1;
      *(ushort *)pCellptr = uVar2 * 0x100 | uVar2 >> 8;
      pCellptr = (u8 *)((long)pCellptr + 2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < nCell + iFirst);
  }
  *ppData = local_60;
  return 0;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content -area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i;
  u8 *aData = pPg->aData;
  u8 *pData = *ppData;
  int iEnd = iFirst + nCell;
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  for(i=iFirst; i<iEnd; i++){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
  }
  *ppData = pData;
  return 0;
}